

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

internals * pybind11::detail::get_internals(void)

{
  bool bVar1;
  int iVar2;
  object *poVar3;
  internals *piVar4;
  long lVar5;
  _Fwd_list_node_base *p_Var6;
  bool bVar7;
  char *id;
  handle builtins;
  handle local_88;
  object local_80;
  char *local_78;
  undefined8 local_70;
  handle local_68;
  item_accessor local_60;
  item_accessor local_40;
  
  if (get_internals::internals_ptr != (internals *)0x0) {
    return get_internals::internals_ptr;
  }
  local_70 = PyEval_GetBuiltins();
  local_78 = "__pybind11_2_1__";
  bVar1 = object_api<pybind11::handle>::contains<char_const*&>
                    ((object_api<pybind11::handle> *)&local_70,&local_78);
  if (bVar1) {
    object_api<pybind11::handle>::operator[]
              (&local_40,(object_api<pybind11::handle> *)&local_70,local_78);
    poVar3 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_40);
    local_68.m_ptr = (poVar3->super_handle).m_ptr;
    if (local_68.m_ptr != (PyObject *)0x0) {
      (local_68.m_ptr)->ob_refcnt = (local_68.m_ptr)->ob_refcnt + 1;
      bVar7 = (local_68.m_ptr)->ob_type == (PyTypeObject *)&PyCapsule_Type;
      goto LAB_003da55a;
    }
  }
  bVar7 = false;
LAB_003da55a:
  if (bVar1) {
    pybind11::object::~object((object *)&local_68);
    pybind11::object::~object(&local_40.cache);
    pybind11::object::~object(&local_40.key);
  }
  if (bVar7) {
    object_api<pybind11::handle>::operator[]
              (&local_60,(object_api<pybind11::handle> *)&local_70,local_78);
    poVar3 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_60);
    local_88.m_ptr = (poVar3->super_handle).m_ptr;
    if (local_88.m_ptr != (PyObject *)0x0) {
      (local_88.m_ptr)->ob_refcnt = (local_88.m_ptr)->ob_refcnt + 1;
    }
    local_80.super_handle.m_ptr = (handle)(PyObject *)0x0;
    get_internals::internals_ptr = capsule::operator_cast_to_internals_((capsule *)&local_88);
    pybind11::object::~object((object *)&local_88);
    pybind11::object::~object(&local_80);
    pybind11::object::~object(&local_60.cache);
    pybind11::object::~object(&local_60.key);
  }
  else {
    piVar4 = (internals *)operator_new(0x168);
    memset(piVar4,0,0x168);
    (piVar4->registered_types_cpp)._M_h._M_buckets =
         &(piVar4->registered_types_cpp)._M_h._M_single_bucket;
    (piVar4->registered_types_cpp)._M_h._M_bucket_count = 1;
    (piVar4->registered_types_cpp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->registered_types_cpp)._M_h._M_element_count = 0;
    (piVar4->registered_types_cpp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar4->registered_types_cpp)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->registered_types_cpp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar4->registered_types_py)._M_h._M_buckets =
         &(piVar4->registered_types_py)._M_h._M_single_bucket;
    (piVar4->registered_types_py)._M_h._M_bucket_count = 1;
    (piVar4->registered_types_py)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->registered_types_py)._M_h._M_element_count = 0;
    (piVar4->registered_types_py)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar4->registered_types_py)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->registered_types_py)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar4->registered_instances)._M_h._M_buckets =
         &(piVar4->registered_instances)._M_h._M_single_bucket;
    (piVar4->registered_instances)._M_h._M_bucket_count = 1;
    (piVar4->registered_instances)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->registered_instances)._M_h._M_element_count = 0;
    (piVar4->registered_instances)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar4->registered_instances)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->registered_instances)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar4->inactive_overload_cache)._M_h._M_buckets =
         &(piVar4->inactive_overload_cache)._M_h._M_single_bucket;
    (piVar4->inactive_overload_cache)._M_h._M_bucket_count = 1;
    (piVar4->inactive_overload_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->inactive_overload_cache)._M_h._M_element_count = 0;
    (piVar4->inactive_overload_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar4->inactive_overload_cache)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->inactive_overload_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar4->direct_conversions)._M_h._M_buckets =
         &(piVar4->direct_conversions)._M_h._M_single_bucket;
    (piVar4->direct_conversions)._M_h._M_bucket_count = 1;
    (piVar4->direct_conversions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->direct_conversions)._M_h._M_element_count = 0;
    (piVar4->direct_conversions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar4->registered_exception_translators).
    super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
    ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
    (piVar4->direct_conversions)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->direct_conversions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar4->shared_data)._M_h._M_buckets = &(piVar4->shared_data)._M_h._M_single_bucket;
    (piVar4->shared_data)._M_h._M_bucket_count = 1;
    (piVar4->shared_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar4->shared_data)._M_h._M_element_count = 0;
    (piVar4->shared_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    piVar4->istate = (PyInterpreterState *)0x0;
    (piVar4->shared_data)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar4->shared_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    piVar4->tstate = 0;
    get_internals::internals_ptr = piVar4;
    PyEval_InitThreads();
    lVar5 = PyThreadState_Get();
    iVar2 = PyThread_create_key();
    get_internals::internals_ptr->tstate = iVar2;
    PyThread_set_key_value(iVar2,lVar5);
    piVar4 = get_internals::internals_ptr;
    get_internals::internals_ptr->istate = *(PyInterpreterState **)(lVar5 + 0x10);
    capsule::capsule((capsule *)&local_88,piVar4,(_func_void_PyObject_ptr *)0x0);
    object_api<pybind11::handle>::operator[]
              (&local_60,(object_api<pybind11::handle> *)&local_70,local_78);
    accessor_policies::generic_item::set(local_60.obj,local_60.key.super_handle,local_88);
    pybind11::object::~object(&local_60.cache);
    pybind11::object::~object(&local_60.key);
    pybind11::object::~object((object *)&local_88);
    piVar4 = get_internals::internals_ptr;
    p_Var6 = (_Fwd_list_node_base *)operator_new(0x10);
    p_Var6->_M_next = (_Fwd_list_node_base *)0x0;
    p_Var6[1]._M_next =
         (_Fwd_list_node_base *)
         get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
    p_Var6->_M_next =
         (piVar4->registered_exception_translators).
         super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
         ._M_impl._M_head._M_next;
    (piVar4->registered_exception_translators).
    super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
    ._M_impl._M_head._M_next = p_Var6;
  }
  return get_internals::internals_ptr;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    static internals *internals_ptr = nullptr;
    if (internals_ptr)
        return *internals_ptr;
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_ptr = capsule(builtins[id]);
    } else {
        internals_ptr = new internals();
        #if defined(WITH_THREAD)
            PyEval_InitThreads();
            PyThreadState *tstate = PyThreadState_Get();
            internals_ptr->tstate = PyThread_create_key();
            PyThread_set_key_value(internals_ptr->tstate, tstate);
            internals_ptr->istate = tstate->interp;
        #endif
        builtins[id] = capsule(internals_ptr);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
    }
    return *internals_ptr;
}